

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O3

int64_t bson_iter_as_int64(bson_iter_t *iter)

{
  size_t *psVar1;
  byte bVar2;
  uint8_t uVar3;
  size_t sVar4;
  ulong uVar5;
  double dVar6;
  long lVar7;
  _Bool _Var8;
  uint uVar9;
  int iVar10;
  int64_t iVar11;
  uint8_t *puVar12;
  void *pvVar13;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  char *pcVar17;
  code *pcVar18;
  bson_oid_t *pbVar19;
  char *__s;
  ulong uVar20;
  ulong *in_RCX;
  uint8_t *puVar21;
  undefined8 uVar22;
  int32_t iVar23;
  undefined4 *extraout_RDX;
  ulong *extraout_RDX_00;
  undefined4 *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  bson_error_t *error;
  size_t __n;
  bson_json_destroy_cb p_Var24;
  bson_t *in_RSI;
  anon_union_24_17_78d57918_for_value *dst;
  bson_json_reader_cb num_bytes;
  size_t sVar25;
  bson_error_t *__s_00;
  bson_t *pbVar26;
  bool bVar27;
  uint32_t uVar28;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_error_t bStack_4e0;
  uint32_t uStack_220;
  _Bool _Stack_219;
  bson_t *pbStack_218;
  uint32_t uStack_210;
  uint32_t uStack_20c;
  uint8_t *puStack_208;
  char *apcStack_200 [40];
  
  if (iter != (bson_iter_t *)0x0) {
    puVar21 = iter->raw;
    bVar2 = puVar21[iter->type];
    iVar11 = 0;
    if (bVar2 < 0x10) {
      if (bVar2 == 1) {
        return (long)*(double *)(puVar21 + iter->d1);
      }
      if (bVar2 == 8) {
        return (ulong)(puVar21[iter->d1] != '\0');
      }
    }
    else if (bVar2 == 0x10) {
      iVar11 = (int64_t)*(int *)(puVar21 + iter->d1);
    }
    else if (bVar2 == 0x12) {
      return *(int64_t *)(puVar21 + iter->d1);
    }
    return iVar11;
  }
  bson_iter_as_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar3 = puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    if (uVar3 == '\x13') {
      lVar14 = *(long *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      lVar7 = *(long *)((long)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8
                       );
      in_RSI->flags = (int)lVar14;
      in_RSI->len = (int)((ulong)lVar14 >> 0x20);
      *(long *)in_RSI->padding = lVar7;
    }
    return CONCAT71((int7)((ulong)puVar21 >> 8),uVar3 == '\x13');
  }
  bson_iter_decimal128_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\a') {
      return 0;
    }
    return (int64_t)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
  }
  bson_iter_oid_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\v') {
      puVar12 = puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      puVar21 = puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      puVar12 = (uint8_t *)0x0;
      puVar21 = (uint8_t *)0x0;
    }
    if (in_RSI != (bson_t *)0x0) {
      *(uint8_t **)in_RSI = puVar21;
    }
    return (int64_t)puVar12;
  }
  bson_iter_regex_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x02') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      return 0;
    }
    if (in_RSI != (bson_t *)0x0) {
      iVar10 = 1;
      if (1 < *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar10 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      in_RSI->flags = iVar10 - 1;
    }
    return (int64_t)(puVar21 +
                    *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
  }
  bson_iter_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      uVar9 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      sVar25 = 1;
      if (1 < (int)*(uint *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        sVar25 = (size_t)*(uint *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
        ;
      }
      uVar28 = (int)sVar25 - 1;
      pvVar13 = bson_malloc0(sVar25);
      memcpy(pvVar13,puVar21 + uVar9,(ulong)uVar28);
      *(undefined1 *)((long)pvVar13 + (ulong)uVar28) = 0;
    }
    else {
      uVar28 = 0;
      pvVar13 = (void *)0x0;
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar28;
    }
    return (int64_t)pvVar13;
  }
  bson_iter_dup_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\r') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      return 0;
    }
    if (in_RSI != (bson_t *)0x0) {
      iVar10 = 1;
      if (1 < *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar10 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      in_RSI->flags = iVar10 - 1;
    }
    return (int64_t)(puVar21 +
                    *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
  }
  bson_iter_code_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_codewscope_cold_2();
  }
  else {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x0f') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      if (extraout_RDX != (undefined4 *)0x0) {
        *extraout_RDX = 0;
      }
      if (in_RCX != (ulong *)0x0) {
        *in_RCX = 0;
      }
      return 0;
    }
    if (in_RSI == (bson_t *)0x0) {
LAB_00111197:
      *extraout_RDX =
           *(undefined4 *)
            (puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      *in_RCX = (ulong)(puVar21 +
                       *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      return (int64_t)(uint8_t *)
                      ((long)(((bson_json_reader_t *)iter)->producer).data +
                      (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    if (*(int *)(puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4))
        != 0) {
      in_RSI->flags =
           *(int *)(puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   ) - 1;
      goto LAB_00111197;
    }
  }
  bson_iter_codewscope_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (extraout_RDX_00 != (ulong *)0x0) {
      *extraout_RDX_00 = 0;
    }
    if (in_RCX != (ulong *)0x0) {
      *in_RCX = 0;
    }
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\f') {
      if (in_RSI != (bson_t *)0x0) {
        uVar9 = *(uint *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        puVar21 = (uint8_t *)(ulong)uVar9;
        in_RSI->flags = uVar9;
        if (uVar9 != 0) {
          puVar21 = (uint8_t *)(ulong)(uVar9 - 1);
          in_RSI->flags = uVar9 - 1;
        }
      }
      if (extraout_RDX_00 != (ulong *)0x0) {
        puVar21 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
        *extraout_RDX_00 = (ulong)puVar21;
      }
      if (in_RCX != (ulong *)0x0) {
        puVar21 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (ulong)puVar21;
      }
    }
    return (int64_t)puVar21;
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      puVar12 = puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar10 = 1;
      if (1 < *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar10 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar28 = iVar10 - 1;
    }
    else {
      puVar12 = (uint8_t *)0x0;
      uVar28 = 0;
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar28;
    }
    return (int64_t)puVar12;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return 0;
    }
    return *(int64_t *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return 0;
    }
    return *(ulong *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) / 1000;
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar28 = 0;
    iVar11 = 0;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      iVar11 = *(int64_t *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar28 = (uint32_t)((ulong)iVar11 >> 0x20);
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar28;
    }
    if (extraout_RDX_01 != (undefined4 *)0x0) {
      *extraout_RDX_01 = (int)iVar11;
    }
    return iVar11;
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      in_RSI->flags = 0;
      in_RSI->len = 0;
      in_RSI->padding[0] = '\0';
      in_RSI->padding[1] = '\0';
      in_RSI->padding[2] = '\0';
      in_RSI->padding[3] = '\0';
      in_RSI->padding[4] = '\0';
      in_RSI->padding[5] = '\0';
      in_RSI->padding[6] = '\0';
      in_RSI->padding[7] = '\0';
      return (int64_t)puVar21;
    }
    lVar14 = *(long *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    *(long *)in_RSI = lVar14 / 1000;
    lVar14 = (lVar14 % 1000) * 1000;
    *(long *)in_RSI->padding = lVar14;
    return lVar14;
  }
  bson_iter_timeval_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if (in_RSI != (bson_t *)0x0) {
    _Var8 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
    if (_Var8) {
      do {
        puVar21 = puStack_208;
        if (*puStack_208 != '\0') {
          sVar15 = strlen((char *)puStack_208);
          _Var8 = bson_utf8_validate((char *)puVar21,sVar15,false);
          if (!_Var8) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if ((*(code **)in_RSI != (code *)0x0) &&
           (uVar16 = (**(code **)in_RSI)(iter,puVar21,extraout_RDX_02), (char)uVar16 != '\0'))
        goto LAB_0011196e;
        switch(uStack_210) {
        case 1:
          pcVar18 = *(code **)(in_RSI->padding + 0x10);
          if (pcVar18 == (code *)0x0) break;
          dVar6 = bson_iter_double(iter);
          uVar16 = (*pcVar18)(SUB84(dVar6,0),iter,puVar21,extraout_RDX_02);
          goto LAB_001118b2;
        case 2:
          pcVar17 = bson_iter_utf8(iter,(uint32_t *)apcStack_200);
          _Var8 = bson_utf8_validate(pcVar17,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var8) {
LAB_00111968:
            uVar9 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            uVar16 = (ulong)uVar9;
            *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar9;
            goto LAB_0011196e;
          }
          pcVar18 = *(code **)(in_RSI->padding + 0x18);
          goto LAB_001117d4;
        case 3:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_document(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var8 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220);
          if (_Var8) {
            pcVar18 = *(code **)(in_RSI->padding + 0x20);
            goto LAB_0011181e;
          }
          break;
        case 4:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_array(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var8 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220);
          if (_Var8) {
            pcVar18 = *(code **)(in_RSI->padding + 0x28);
            goto LAB_0011181e;
          }
          break;
        case 5:
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)((ulong)pbStack_218 & 0xffffffff00000000);
          uStack_220 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_218,&uStack_220,(uint8_t **)apcStack_200)
          ;
          if (*(code **)(in_RSI->padding + 0x30) != (code *)0x0) {
            uVar16 = (**(code **)(in_RSI->padding + 0x30))
                               (iter,puVar21,(ulong)pbStack_218 & 0xffffffff,uStack_220,
                                apcStack_200[0],extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 6:
          pcVar18 = *(code **)(in_RSI->padding + 0x38);
          goto LAB_0011178a;
        case 7:
          pcVar18 = *(code **)(in_RSI->padding + 0x40);
          if (pcVar18 != (code *)0x0) {
            pbVar19 = bson_iter_oid(iter);
LAB_001118a3:
            uVar16 = (*pcVar18)(iter,puVar21,pbVar19,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 8:
          pcVar18 = *(code **)(in_RSI->padding + 0x48);
          if (pcVar18 != (code *)0x0) {
            _Var8 = bson_iter_bool(iter);
            uVar9 = (uint)_Var8;
LAB_00111710:
            uVar16 = (*pcVar18)(iter,puVar21,uVar9,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 9:
          pcVar18 = *(code **)(in_RSI->padding + 0x50);
          if (pcVar18 != (code *)0x0) {
            pbVar19 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_001118a3;
          }
          break;
        case 10:
          pcVar18 = *(code **)(in_RSI->padding + 0x58);
LAB_0011178a:
          if (pcVar18 == (code *)0x0) break;
LAB_00111799:
          uVar16 = (*pcVar18)(iter,puVar21,extraout_RDX_02);
          goto LAB_001118b2;
        case 0xb:
          apcStack_200[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_200);
          sVar15 = strlen(__s);
          _Var8 = bson_utf8_validate(__s,sVar15,true);
          if (!_Var8) goto LAB_00111968;
          pcVar18 = *(code **)(in_RSI->padding + 0x60);
          pcVar17 = apcStack_200[0];
          if (pcVar18 == (code *)0x0) break;
          goto LAB_0011188b;
        case 0xc:
          uStack_220 = 0;
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_220,apcStack_200,(bson_oid_t **)&pbStack_218);
          _Var8 = bson_utf8_validate(apcStack_200[0],(ulong)uStack_220,true);
          if (!_Var8) goto LAB_00111968;
          pcVar18 = *(code **)(in_RSI->padding + 0x68);
          pcVar17 = apcStack_200[0];
          pbVar26 = pbStack_218;
          if (pcVar18 != (code *)0x0) {
LAB_001115a8:
            uVar16 = (*pcVar18)(iter,puVar21,uStack_220,pcVar17,pbVar26,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 0xd:
          pcVar17 = bson_iter_code(iter,(uint32_t *)apcStack_200);
          _Var8 = bson_utf8_validate(pcVar17,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var8) goto LAB_00111968;
          pcVar18 = *(code **)(in_RSI->padding + 0x70);
          goto LAB_001117d4;
        case 0xe:
          pcVar17 = bson_iter_symbol(iter,(uint32_t *)apcStack_200);
          _Var8 = bson_utf8_validate(pcVar17,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var8) goto LAB_00111968;
          pcVar18 = *(code **)(in_RSI + 1);
LAB_001117d4:
          if (pcVar18 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_200[0] & 0xffffffff);
LAB_0011188b:
            uVar16 = (*pcVar18)(iter,puVar21,__s,pcVar17,extraout_RDX_02);
LAB_001118b2:
            if ((char)uVar16 != '\0') goto LAB_0011196e;
          }
          break;
        case 0xf:
          uStack_220 = 0;
          pbStack_218 = (bson_t *)0x0;
          uStack_20c = 0;
          pcVar17 = bson_iter_codewscope(iter,&uStack_220,&uStack_20c,(uint8_t **)&pbStack_218);
          _Var8 = bson_utf8_validate(pcVar17,(ulong)uStack_220,true);
          if (!_Var8) goto LAB_00111968;
          _Var8 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_20c);
          if ((_Var8) && (pcVar18 = *(code **)in_RSI[1].padding, pcVar18 != (code *)0x0)) {
            pbVar26 = (bson_t *)apcStack_200;
            goto LAB_001115a8;
          }
          break;
        case 0x10:
          pcVar18 = *(code **)(in_RSI[1].padding + 8);
          if (pcVar18 != (code *)0x0) {
            uVar9 = bson_iter_int32(iter);
            goto LAB_00111710;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_200,(uint32_t *)&pbStack_218);
          if (*(code **)(in_RSI[1].padding + 0x10) != (code *)0x0) {
            uVar16 = (**(code **)(in_RSI[1].padding + 0x10))
                               (iter,puVar21,(ulong)apcStack_200[0] & 0xffffffff,
                                (ulong)pbStack_218 & 0xffffffff,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 0x12:
          pcVar18 = *(code **)(in_RSI[1].padding + 0x18);
          if (pcVar18 != (code *)0x0) {
            pbVar19 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_001118a3;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_200);
          pcVar18 = *(code **)(in_RSI[1].padding + 0x38);
LAB_0011181e:
          if (pcVar18 != (code *)0x0) {
            uVar16 = (*pcVar18)(iter,puVar21,(bson_t *)apcStack_200,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        default:
          if (uStack_210 == 0x7f) {
            pcVar18 = *(code **)(in_RSI[1].padding + 0x20);
          }
          else {
            if (uStack_210 != 0xff) break;
            pcVar18 = *(code **)(in_RSI[1].padding + 0x28);
          }
          if (pcVar18 == (code *)0x0) break;
          puVar21 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_00111799;
        }
        if ((*(code **)in_RSI->padding != (code *)0x0) &&
           (uVar16 = (**(code **)in_RSI->padding)
                               (iter,(uint8_t *)
                                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                                     (ulong)*(uint32_t *)
                                             ((long)&(((bson_json_reader_t *)iter)->producer).dcb +
                                             4)),extraout_RDX_02), (char)uVar16 != '\0')) {
LAB_0011196e:
          return CONCAT71((int7)(uVar16 >> 8),1);
        }
        _Var8 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
      } while (_Var8);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_219 == true) && (*(long *)(in_RSI[1].padding + 0x30) != 0)) {
        sVar15 = strlen((char *)puStack_208);
        _Var8 = bson_utf8_validate((char *)puStack_208,sVar15,false);
        if (_Var8) {
          (**(code **)(in_RSI[1].padding + 0x30))(iter,puStack_208,uStack_210,extraout_RDX_02);
          return 0;
        }
      }
      if (*(code **)(in_RSI->padding + 8) != (code *)0x0) {
        (**(code **)(in_RSI->padding + 8))(iter,extraout_RDX_02);
      }
    }
    return 0;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)in_RSI;
    }
    return (int64_t)puVar21;
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)in_RSI;
    }
    return (int64_t)puVar21;
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(bson_t **)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = in_RSI;
    }
    return (int64_t)puVar21;
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return (int64_t)puVar21;
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      uVar9 = *(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      lVar14 = *(long *)in_RSI->padding;
      *(long *)(puVar21 + uVar9) = *(long *)in_RSI;
      *(long *)((long)(puVar21 + uVar9) + 8) = lVar14;
    }
    return (int64_t)puVar21;
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if (in_RSI != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = in_RSI;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_4e0;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      sVar25 = (((bson_json_reader_t *)iter)->producer).bytes_read;
      bVar27 = false;
      while( true ) {
        sVar4 = ((bson_json_reader_t *)iter)->json->pos;
        if (sVar25 == 0) {
          sVar25 = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)sVar25 < 0) {
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
            return 0xffffffff;
          }
          return 0xffffffff;
        }
        if (sVar25 == 0) break;
        (((bson_json_reader_t *)iter)->producer).bytes_read = sVar25;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,sVar25);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar21 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar21,puVar21 + ((bson_json_reader_t *)iter)->advance,
                  sVar25 - ((bson_json_reader_t *)iter)->advance);
          psVar1 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar1 = *psVar1 - ((bson_json_reader_t *)iter)->advance;
          goto LAB_00111ddb;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) {
          return 0xffffffff;
        }
        uVar16 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar16 != 0xffffffffffffffff) &&
           (uVar5 = ((bson_json_reader_t *)iter)->json->pos, uVar20 = uVar5 - uVar16,
           uVar16 <= uVar5 && uVar20 != 0)) {
          if (uVar20 < sVar25) {
            sVar25 = uVar20;
          }
          lVar14 = uVar16 - sVar4;
          if (lVar14 < 1) {
            lVar14 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar14,sVar25);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        bVar27 = true;
        sVar25 = 0;
      }
      if (!bVar27) {
        return 0;
      }
LAB_00111ddb:
      if ((((bson_json_reader_t *)iter)->bson).read_state != BSON_JSON_DONE) {
        _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
        return 0xffffffff;
      }
      return 1;
    }
    bson_json_reader_read_cold_1();
    p_Var24 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var24 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
      pvVar13 = (((bson_json_reader_t *)iter)->producer).data;
    }
    else {
      pvVar13 = (((bson_json_reader_t *)iter)->producer).data;
      if ((((bson_json_reader_t *)iter)->producer).cb < p_Var24 + __n + 1) {
        uVar16 = (ulong)(p_Var24 + __n) >> 1 | (ulong)(p_Var24 + __n);
        uVar16 = uVar16 >> 2 | uVar16;
        uVar16 = uVar16 >> 4 | uVar16;
        uVar16 = uVar16 >> 8 | uVar16;
        uVar16 = uVar16 >> 0x10 | uVar16;
        num_bytes = (bson_json_reader_cb)((uVar16 >> 0x20 | uVar16) + 1);
        (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
        pvVar13 = bson_realloc(pvVar13,(size_t)num_bytes);
        (((bson_json_reader_t *)iter)->producer).data = pvVar13;
      }
    }
    memcpy((bson_json_destroy_cb)
           ((long)pvVar13 + (long)(((bson_json_reader_t *)iter)->producer).dcb),in_RSI,__n);
    p_Var24 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var24;
    pvVar13 = (((bson_json_reader_t *)iter)->producer).data;
    p_Var24[(long)pvVar13] = (_func_void_void_ptr)0x0;
    return (int64_t)pvVar13;
  }
  puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar9 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar2 = puVar21[uVar9];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type = (uint)bVar2
  ;
  switch(bVar2) {
  case 1:
    dVar6 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar6;
    break;
  case 2:
    pcVar17 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar19 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111b7e;
  case 8:
    _Var8 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var8;
    break;
  case 9:
    pcVar17 = (char *)bson_iter_date_time(iter);
    goto LAB_00111c23;
  case 0xb:
    pcVar17 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar19 = (bson_oid_t *)0x0;
    if (puVar21[uVar9] == '\f') {
      uVar9 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar10 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar10 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar10;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar21 + uVar9);
      pbVar19 = (bson_oid_t *)(puVar21 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111b7e:
    bson_oid_copy(pbVar19,&dst->v_oid);
    break;
  case 0xd:
    if (puVar21[uVar9] == '\r') {
      iVar10 = 1;
      if (1 < *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar10 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar10 = iVar10 + -1;
      puVar12 = puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      iVar10 = 0;
      puVar12 = (uint8_t *)0x0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar10;
    goto LAB_00111c30;
  case 0xe:
    if (puVar21[uVar9] == '\x0e') {
      puVar12 = puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar10 = 1;
      if (1 < *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar10 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar10 = iVar10 + -1;
    }
    else {
      puVar12 = (uint8_t *)0x0;
      iVar10 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar10;
LAB_00111c30:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar12;
    break;
  case 0xf:
    pcVar17 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0x10:
    iVar23 = 0;
    if (puVar21[uVar9] == '\x10') {
      iVar23 = *(int32_t *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar23;
    break;
  case 0x11:
    iVar23 = 0;
    uVar22 = 0;
    if (puVar21[uVar9] == '\x11') {
      uVar22 = *(undefined8 *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar23 = (int32_t)((ulong)uVar22 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar23;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar22;
    break;
  case 0x12:
    if (puVar21[uVar9] == '\x12') {
      pcVar17 = *(char **)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar17 = (char *)0x0;
    }
LAB_00111c23:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar17;
    break;
  case 0x13:
    if (puVar21[uVar9] == '\x13') {
      iVar11 = *(int64_t *)
                ((long)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar11;
    }
    break;
  default:
    if ((bVar2 != BSON_TYPE_MAXKEY) && (bVar2 != 0xff)) {
      return 0;
    }
  }
  return (int64_t)(bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed;
}

Assistant:

int64_t
bson_iter_as_int64 (const bson_iter_t *iter) /* IN */
{
   BSON_ASSERT (iter);

   switch ((int) ITER_TYPE (iter)) {
   case BSON_TYPE_BOOL:
      return (int64_t) bson_iter_bool (iter);
   case BSON_TYPE_DOUBLE:
      return (int64_t) bson_iter_double (iter);
   case BSON_TYPE_INT64:
      return bson_iter_int64 (iter);
   case BSON_TYPE_INT32:
      return (int64_t) bson_iter_int32 (iter);
   default:
      return 0;
   }
}